

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

void HistogramAdd(VP8LHistogram *h1,VP8LHistogram *h2,VP8LHistogram *hout)

{
  long in_RDX;
  long in_RSI;
  long in_RDI;
  bool bVar1;
  uint32_t *pout;
  uint32_t *pout_const;
  uint32_t *p2;
  uint32_t *p1;
  int length;
  int i;
  undefined4 in_stack_ffffffffffffffb8;
  undefined2 uVar2;
  undefined4 in_stack_ffffffffffffffbc;
  uint32_t **in_stack_ffffffffffffffc0;
  undefined4 local_38;
  HistogramIndex in_stack_ffffffffffffffcc;
  VP8LHistogram *in_stack_ffffffffffffffd0;
  uint32_t *local_28;
  int local_20;
  int local_1c;
  
  for (local_1c = 0; local_1c < 5; local_1c = local_1c + 1) {
    GetPopulationInfo(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0,
                      (int *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    GetPopulationInfo(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0,
                      (int *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    GetPopulationInfo(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0,
                      (int *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    in_stack_ffffffffffffffc0 = (uint32_t **)CONCAT44(in_stack_ffffffffffffffcc,local_38);
    if (in_RSI == in_RDX) {
      if (*(char *)(in_RDI + 0xce8 + (long)local_1c) != '\0') {
        if (*(char *)(in_RDX + 0xce8 + (long)local_1c) == '\0') {
          memcpy(in_stack_ffffffffffffffc0,local_28,(long)local_20 << 2);
        }
        else {
          (*VP8LAddVectorEq)(local_28,(uint32_t *)in_stack_ffffffffffffffc0,local_20);
        }
      }
    }
    else if (*(char *)(in_RDI + 0xce8 + (long)local_1c) == '\0') {
      if (*(char *)(in_RSI + 0xce8 + (long)local_1c) == '\0') {
        memset(in_stack_ffffffffffffffc0,0,(long)local_20 << 2);
      }
      else {
        memcpy(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffd0,(long)local_20 << 2);
      }
    }
    else if (*(char *)(in_RSI + 0xce8 + (long)local_1c) == '\0') {
      memcpy(in_stack_ffffffffffffffc0,local_28,(long)local_20 << 2);
    }
    else {
      (*VP8LAddVector)(local_28,(uint32_t *)in_stack_ffffffffffffffd0,
                       (uint32_t *)in_stack_ffffffffffffffc0,local_20);
    }
  }
  for (local_1c = 0; local_1c < 5; local_1c = local_1c + 1) {
    if (*(short *)(in_RDI + 0xcac + (long)local_1c * 2) ==
        *(short *)(in_RSI + 0xcac + (long)local_1c * 2)) {
      uVar2 = *(undefined2 *)(in_RDI + 0xcac + (long)local_1c * 2);
    }
    else {
      uVar2 = 0xffff;
    }
    *(undefined2 *)(in_RDX + 0xcac + (long)local_1c * 2) = uVar2;
    bVar1 = true;
    if (*(char *)(in_RDI + 0xce8 + (long)local_1c) == '\0') {
      bVar1 = *(char *)(in_RSI + 0xce8 + (long)local_1c) != '\0';
    }
    *(bool *)(in_RDX + 0xce8 + (long)local_1c) = bVar1;
  }
  return;
}

Assistant:

static WEBP_INLINE void HistogramAdd(const VP8LHistogram* const h1,
                                     const VP8LHistogram* const h2,
                                     VP8LHistogram* const hout) {
  int i;
  assert(h1->palette_code_bits == h2->palette_code_bits);

  for (i = 0; i < 5; ++i) {
    int length;
    const uint32_t *p1, *p2, *pout_const;
    uint32_t* pout;
    GetPopulationInfo(h1, (HistogramIndex)i, &p1, &length);
    GetPopulationInfo(h2, (HistogramIndex)i, &p2, &length);
    GetPopulationInfo(hout, (HistogramIndex)i, &pout_const, &length);
    pout = (uint32_t*)pout_const;
    if (h2 == hout) {
      if (h1->is_used[i]) {
        if (hout->is_used[i]) {
          VP8LAddVectorEq(p1, pout, length);
        } else {
          memcpy(pout, p1, length * sizeof(pout[0]));
        }
      }
    } else {
      if (h1->is_used[i]) {
        if (h2->is_used[i]) {
          VP8LAddVector(p1, p2, pout, length);
        } else {
          memcpy(pout, p1, length * sizeof(pout[0]));
        }
      } else if (h2->is_used[i]) {
        memcpy(pout, p2, length * sizeof(pout[0]));
      } else {
        memset(pout, 0, length * sizeof(pout[0]));
      }
    }
  }

  for (i = 0; i < 5; ++i) {
    hout->trivial_symbol[i] = h1->trivial_symbol[i] == h2->trivial_symbol[i]
                                  ? h1->trivial_symbol[i]
                                  : VP8L_NON_TRIVIAL_SYM;
    hout->is_used[i] = h1->is_used[i] || h2->is_used[i];
  }
}